

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_UTF8Reader.cpp
# Opt level: O1

char * __thiscall soul::UTF8Reader::findInvalidData(UTF8Reader *this)

{
  byte bVar1;
  bool bVar2;
  UnicodeChar UVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  byte *unaff_R14;
  byte *pbVar8;
  UTF8Reader local_38;
  
  pbVar8 = (byte *)this->data;
  do {
    bVar1 = *pbVar8;
    if (bVar1 == 0) {
      return (char *)0x0;
    }
    pbVar4 = pbVar8 + 1;
    bVar2 = true;
    if ((char)bVar1 < '\0') {
      uVar7 = 0;
      if ((bVar1 & 0x40) != 0) {
        uVar5 = 0x40;
        uVar7 = 0;
        do {
          if (((int)uVar7 == 4) ||
             ((uVar5 = uVar5 >> 1, uVar5 == 8 &&
              (local_38.data = (char *)pbVar4, UVar3 = operator*(&local_38), 0x10ffff < UVar3))))
          goto LAB_001badba;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while ((uVar5 & bVar1) != 0);
      }
      iVar6 = (int)uVar7;
      if (iVar6 == 0) {
LAB_001badba:
        bVar2 = false;
        unaff_R14 = pbVar8;
      }
      else {
        pbVar4 = pbVar8 + uVar7 + 1;
        bVar2 = iVar6 < 1;
        if (0 < iVar6) {
          pbVar4 = pbVar8 + 2;
          unaff_R14 = pbVar8;
        }
      }
    }
    pbVar8 = pbVar4;
    if (!bVar2) {
      return (char *)unaff_R14;
    }
  } while( true );
}

Assistant:

const char* UTF8Reader::findInvalidData() const
{
    for (auto t = data; *t != 0;)
    {
        auto byte = (signed char) *t++;

        if (byte < 0)
        {
            auto errorPos = t - 1;
            int bit = 0x40;
            int numExtraValues = 0;

            while ((byte & bit) != 0)
            {
                if (bit < 8)
                    return errorPos;

                ++numExtraValues;
                bit >>= 1;

                if (bit == 8 && *UTF8Reader (t) > 0x10ffff)
                    return errorPos;
            }

            if (numExtraValues == 0)
                return errorPos;

            while (--numExtraValues >= 0)
                if ((*t++ & 0xc0) != 0x80)
                    return errorPos;
        }
    }

    return nullptr;
}